

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

String * doctest::toString(String *__return_storage_ptr__,Approx *in)

{
  double dVar1;
  char *pcVar2;
  anon_union_24_2_13149d16_for_String_3 local_70;
  anon_union_24_2_13149d16_for_String_3 local_58;
  anon_union_24_2_13149d16_for_String_3 local_40;
  anon_union_24_2_13149d16_for_String_3 local_28;
  
  pcVar2 = String::allocate((String *)&local_40.data,8);
  builtin_strncpy(pcVar2,"Approx( ",8);
  dVar1 = in->m_value;
  detail::tlssPush();
  std::ostream::_M_insert<double>(dVar1);
  detail::tlssPop();
  operator+((String *)&local_28.data,(String *)&local_40.data,(String *)&local_58.data);
  pcVar2 = String::allocate((String *)&local_70.data,2);
  pcVar2[0] = ' ';
  pcVar2[1] = ')';
  operator+(__return_storage_ptr__,(String *)&local_28.data,(String *)&local_70.data);
  if ((local_70.buf[0x17] < '\0') && (local_70.data.ptr != (char *)0x0)) {
    operator_delete__(local_70.data.ptr);
  }
  if ((local_28.buf[0x17] < '\0') && (local_28.data.ptr != (char *)0x0)) {
    operator_delete__(local_28.data.ptr);
  }
  if ((local_58.buf[0x17] < '\0') && (local_58.data.ptr != (char *)0x0)) {
    operator_delete__(local_58.data.ptr);
  }
  if ((local_40.buf[0x17] < '\0') && (local_40.data.ptr != (char *)0x0)) {
    operator_delete__(local_40.data.ptr);
  }
  return __return_storage_ptr__;
}

Assistant:

String toString(const Approx& in) {
    return "Approx( " + doctest::toString(in.m_value) + " )";
}